

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

parser_error parse_shape_dice(parser *p)

{
  long *plVar1;
  _Bool _Var2;
  void *pvVar3;
  long *plVar4;
  dice_t *dice;
  char *string;
  parser_error pVar5;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar5 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pVar5 = PARSE_ERROR_NONE;
    plVar1 = *(long **)((long)pvVar3 + 0x100);
    if (*(long **)((long)pvVar3 + 0x100) != (long *)0x0) {
      do {
        plVar4 = plVar1;
        plVar1 = (long *)*plVar4;
      } while ((long *)*plVar4 != (long *)0x0);
      dice = dice_new();
      if (dice != (dice_t *)0x0) {
        string = parser_getstr(p,"dice");
        _Var2 = dice_parse_string(dice,string);
        if (_Var2) {
          dice_free((dice_t *)plVar4[2]);
          plVar4[2] = (long)dice;
          return PARSE_ERROR_NONE;
        }
        dice_free(dice);
      }
      pVar5 = PARSE_ERROR_INVALID_DICE;
    }
  }
  return pVar5;
}

Assistant:

static enum parser_error parse_shape_dice(struct parser *p) {
	struct player_shape *shape = parser_priv(p);
	struct effect *effect;
	dice_t *dice;
	const char *string;

	if (!shape) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	/* If there is no effect, assume that this is human and not parser error. */
	effect = shape->effect;
	if (effect == NULL) {
		return PARSE_ERROR_NONE;
	}
	while (effect->next) effect = effect->next;

	dice = dice_new();
	if (dice == NULL) {
		return PARSE_ERROR_INVALID_DICE;
	}

	string = parser_getstr(p, "dice");
	if (dice_parse_string(dice, string)) {
		dice_free(effect->dice);
		effect->dice = dice;
	} else {
		dice_free(dice);
		return PARSE_ERROR_INVALID_DICE;
	}

	return PARSE_ERROR_NONE;
}